

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_create_map_iterator(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  JSValueUnion *pJVar4;
  ulong uVar5;
  uint uVar6;
  JSValueUnion JVar7;
  JSClassID class_id;
  JSValue JVar8;
  JSValue JVar9;
  JSValueUnion local_40;
  int64_t local_38;
  
  JVar7 = this_val.u;
  pvVar2 = JS_GetOpaque2(ctx,this_val,(magic & 3U) + 0x1f);
  if (pvVar2 != (void *)0x0) {
    class_id = (magic & 3U) + 0x23;
    uVar3 = (ulong)(class_id * 0x10);
    JVar8.tag = *(int64_t *)((long)&ctx->class_proto->tag + uVar3);
    JVar8.u.ptr = ((JSValueUnion *)((long)&ctx->class_proto->u + uVar3))->ptr;
    JVar8 = JS_NewObjectProtoClass(ctx,JVar8,class_id);
    uVar6 = (uint)JVar8.tag;
    if (uVar6 != 6) {
      pJVar4 = (JSValueUnion *)js_malloc(ctx,0x20);
      local_40 = JVar8.u;
      local_38 = JVar8.tag;
      if (pJVar4 != (JSValueUnion *)0x0) {
        if (0xfffffff4 < (uint)this_val.tag) {
          *(int *)JVar7.ptr = *JVar7.ptr + 1;
        }
        pJVar4->ptr = (void *)JVar7;
        pJVar4[1] = (JSValueUnion)this_val.tag;
        pJVar4[2].int32 = magic >> 2;
        pJVar4[3].float64 = 0.0;
        if (uVar6 == 0xffffffff) {
          *(JSValueUnion **)((long)local_40.ptr + 0x30) = pJVar4;
        }
        uVar5 = (ulong)local_40.ptr & 0xffffffff00000000;
        uVar3 = (ulong)local_40.ptr & 0xffffffff;
        goto LAB_00148335;
      }
      if ((0xfffffff4 < uVar6) &&
         (iVar1 = *local_40.ptr, *(int *)local_40.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar8);
      }
    }
  }
  uVar3 = 0;
  uVar5 = 0;
  local_38 = 6;
LAB_00148335:
  JVar9.u.ptr = (void *)(uVar3 | uVar5);
  JVar9.tag = local_38;
  return JVar9;
}

Assistant:

static JSValue js_create_map_iterator(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv, int magic)
{
    JSIteratorKindEnum kind;
    JSMapState *s;
    JSMapIteratorData *it;
    JSValue enum_obj;

    kind = magic >> 2;
    magic &= 3;
    s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    if (!s)
        return JS_EXCEPTION;
    enum_obj = JS_NewObjectClass(ctx, JS_CLASS_MAP_ITERATOR + magic);
    if (JS_IsException(enum_obj))
        goto fail;
    it = js_malloc(ctx, sizeof(*it));
    if (!it) {
        JS_FreeValue(ctx, enum_obj);
        goto fail;
    }
    it->obj = JS_DupValue(ctx, this_val);
    it->kind = kind;
    it->cur_record = NULL;
    JS_SetOpaque(enum_obj, it);
    return enum_obj;
 fail:
    return JS_EXCEPTION;
}